

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O0

int __thiscall smf::Options::storeOption(Options *this,int gargp,int *position,int *running)

{
  char cVar1;
  char cVar2;
  reference pvVar3;
  char *pcVar4;
  ostream *poVar5;
  bool bVar6;
  allocator local_1111;
  string local_1110;
  allocator local_10e9;
  string local_10e8;
  allocator local_10c1;
  string local_10c0;
  allocator local_1099;
  string local_1098;
  allocator local_1061;
  string local_1060;
  char local_1039;
  char local_1038 [7];
  char optionType;
  char tempname [4096];
  int optionForm;
  int *running_local;
  int *position_local;
  int gargp_local;
  Options *this_local;
  
  local_1039 = '\0';
  if (*running == 0) {
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->m_oargv,(long)gargp);
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)pvVar3);
    cVar1 = *pcVar4;
    cVar2 = getFlag(this);
    tempname[0xffd] = '\0';
    tempname[0xffe] = '\0';
    tempname[0xfff] = '\0';
    tempname[0xffc] = cVar1 == cVar2;
  }
  else {
    tempname[0xffc] = '\x02';
    tempname[0xffd] = '\0';
    tempname[0xffe] = '\0';
    tempname[0xfff] = '\0';
  }
  if (tempname._4092_4_ == 0) {
    *position = 1;
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->m_oargv,(long)gargp);
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)pvVar3);
    local_1038[0] = *pcVar4;
    local_1038[1] = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1098,local_1038,&local_1099);
    local_1039 = getType(this,&local_1098);
    std::__cxx11::string::~string((string *)&local_1098);
    std::allocator<char>::~allocator((allocator<char> *)&local_1099);
    if (local_1039 != 'b') {
      *position = *position + 1;
    }
  }
  else if (tempname._4092_4_ == 1) {
    *position = 2;
    while( true ) {
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&this->m_oargv,(long)gargp);
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)pvVar3);
      bVar6 = false;
      if (*pcVar4 != '=') {
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&this->m_oargv,(long)gargp);
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)pvVar3);
        bVar6 = *pcVar4 != '\0';
      }
      if (!bVar6) break;
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&this->m_oargv,(long)gargp);
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)pvVar3);
      local_1038[*position + -2] = *pcVar4;
      *position = *position + 1;
    }
    local_1038[*position + -2] = '\0';
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_10c0,local_1038,&local_10c1);
    local_1039 = getType(this,&local_10c0);
    std::__cxx11::string::~string((string *)&local_10c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_10c1);
    if (local_1039 == '\0') {
      this->m_optionsArgument = true;
    }
    else {
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&this->m_oargv,(long)gargp);
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)pvVar3);
      if (*pcVar4 == '=') {
        if (local_1039 == 'b') {
          poVar5 = std::operator<<((ostream *)&std::cerr,
                                   "Error: boolean variable cannot have any options: ");
          poVar5 = std::operator<<(poVar5,local_1038);
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          exit(1);
        }
        *position = *position + 1;
      }
    }
  }
  else if (tempname._4092_4_ == 2) {
    *position = *position + 1;
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->m_oargv,(long)gargp);
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)pvVar3);
    local_1038[0] = *pcVar4;
    local_1038[1] = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1060,local_1038,&local_1061);
    local_1039 = getType(this,&local_1060);
    std::__cxx11::string::~string((string *)&local_1060);
    std::allocator<char>::~allocator((allocator<char> *)&local_1061);
    if (local_1039 != 'b') {
      *running = 0;
      *position = *position + 1;
    }
  }
  if (local_1039 == '\0') {
    this->m_optionsArgument = true;
    *position = 0;
    return gargp + 1;
  }
  pvVar3 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](&this->m_oargv,(long)gargp);
  pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)pvVar3);
  position_local._4_4_ = gargp;
  if ((*pcVar4 == '\0') && (local_1039 != 'b')) {
    position_local._4_4_ = gargp + 1;
    *position = 0;
  }
  if ((tempname._4092_4_ != 1) && (local_1039 == 'b')) {
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->m_oargv,(long)position_local._4_4_);
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)pvVar3);
    if (*pcVar4 != '\0') {
      *running = 1;
      goto LAB_0013d466;
    }
  }
  if (local_1039 == 'b') {
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->m_oargv,(long)position_local._4_4_);
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)pvVar3);
    if (*pcVar4 == '\0') {
      *running = 0;
    }
  }
LAB_0013d466:
  if (position_local._4_4_ < this->m_oargc) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_10e8,local_1038,&local_10e9);
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->m_oargv,(long)position_local._4_4_);
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)pvVar3);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1110,pcVar4,&local_1111);
    setModified(this,&local_10e8,&local_1110);
    std::__cxx11::string::~string((string *)&local_1110);
    std::allocator<char>::~allocator((allocator<char> *)&local_1111);
    std::__cxx11::string::~string((string *)&local_10e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_10e9);
    if (*running == 0) {
      position_local._4_4_ = position_local._4_4_ + 1;
    }
    return position_local._4_4_;
  }
  poVar5 = std::operator<<((ostream *)&std::cerr,"Error: last option requires a parameter");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  exit(1);
}

Assistant:

int Options::storeOption(int gargp, int& position, int& running) {
	int optionForm;
	char tempname[4096];
	char optionType = OPTION_TYPE_unknown;

	if (running) {
		optionForm = OPTION_FORM_continue;
	} else if (m_oargv[gargp][1] == getFlag()) {
		optionForm = OPTION_FORM_long;
	} else {
		optionForm = OPTION_FORM_short;
	}

	switch (optionForm) {
		case OPTION_FORM_continue:
			position++;
			tempname[0] = m_oargv[gargp][position];
			tempname[1] = '\0';
			optionType = getType(tempname);
			if (optionType != OPTION_TYPE_boolean) {
				running = 0;
				position++;
			}
			break;
		case OPTION_FORM_short:
			position = 1;
			tempname[0] = m_oargv[gargp][position];
			tempname[1] = '\0';
			optionType = getType(tempname);
			if (optionType != OPTION_TYPE_boolean) {
				position++;
			}
			break;
		case OPTION_FORM_long:
			position = 2;
			while (m_oargv[gargp][position] != '=' &&
					m_oargv[gargp][position] != '\0') {
				tempname[position-2] = m_oargv[gargp][position];
				position++;
			}
			tempname[position-2] = '\0';
			optionType = getType(tempname);
			if (optionType == OPTION_TYPE_unknown) { // suppressed --options option
				m_optionsArgument = 1;
				break;
			}
			if (m_oargv[gargp][position] == '=') {
				if (optionType == OPTION_TYPE_boolean) {
					std::cerr << "Error: boolean variable cannot have any options: "
					     << tempname << std::endl;
					exit(1);
				}
				position++;
			}
			break;
	}

	if (optionType == OPTION_TYPE_unknown) { // suppressed --options option
		m_optionsArgument = 1;
		gargp++;
		position = 0;
		return gargp;
	}

	if (m_oargv[gargp][position] == '\0' &&
			optionType != OPTION_TYPE_boolean) {
		gargp++;
		position = 0;
	}

	if ((optionForm != OPTION_FORM_long) && (optionType == OPTION_TYPE_boolean) &&
			(m_oargv[gargp][position+1] != '\0')) {
		running = 1;
	} else if ((optionType == OPTION_TYPE_boolean) &&
			(m_oargv[gargp][position+1] == '\0')) {
		running = 0;
	}

	if (gargp >= m_oargc) {
		std::cerr << "Error: last option requires a parameter" << std::endl;
		exit(1);
	}
	setModified(tempname, &m_oargv[gargp][position]);

	if (!running) {
		gargp++;
	}
	return gargp;
}